

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

Var Js::JavascriptArray::MapHelper<unsigned_long>
              (JavascriptArray *pArr,TypedArrayBase *typedArrayBase,RecyclableObject *obj,
              unsigned_long length,Arguments *args,ScriptContext *scriptContext)

{
  ThreadContext *pTVar1;
  code *pcVar2;
  anon_class_24_1_2f014396_conflict3 implicitCall;
  undefined1 auVar3 [8];
  bool bVar4;
  int iVar5;
  Var pvVar6;
  JavascriptFunction *defaultConstructor;
  JavascriptFunction *instanceObj;
  JavascriptArray *this;
  JavascriptCopyOnAccessNativeIntArray *this_00;
  undefined4 *puVar7;
  JavascriptMethod p_Var8;
  uint64 uVar9;
  uint64 uVar10;
  TypedArrayBase *pTVar11;
  undefined4 extraout_var;
  char16_t *varName;
  uint32 index;
  ulong uVar12;
  ulong uVar13;
  undefined1 auStack_d0 [8];
  Var element;
  ScriptContext *local_c0;
  ulong local_b8;
  JavascriptFunction *local_b0;
  RecyclableObject *local_a8;
  JavascriptArray *local_a0;
  JavascriptArray *local_98;
  double local_90;
  undefined4 *local_88;
  undefined1 local_80 [8];
  JsReentLock jsReentLock;
  TypedArrayBase *local_50;
  JavascriptArray *local_40;
  bool local_31 [8];
  bool isBuiltinArrayCtor;
  
  local_80 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_80)->noJsReentrancy;
  ((ThreadContext *)local_80)->noJsReentrancy = true;
  local_98 = pArr;
  JsReentLock::setObjectForMutation((JsReentLock *)local_80,pArr);
  local_31[0] = true;
  if (((ulong)args->Info & 0xfffffe) == 0) {
LAB_00b9a891:
    varName = L"[TypedArray].prototype.map";
    if (typedArrayBase == (TypedArrayBase *)0x0) {
      varName = L"Array.prototype.map";
    }
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec34,varName);
  }
  pvVar6 = Arguments::operator[](args,1);
  bVar4 = JavascriptConversion::IsCallable(pvVar6);
  if (!bVar4) goto LAB_00b9a891;
  pvVar6 = Arguments::operator[](args,1);
  jsReentLock._24_8_ = VarTo<Js::RecyclableObject>(pvVar6);
  if ((*(uint *)&args->Info & 0xffffff) < 3) {
    local_a8 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
               super_JavascriptLibraryBase).undefinedValue.ptr;
  }
  else {
    local_a8 = (RecyclableObject *)Arguments::operator[](args,2);
  }
  if (local_98 == (JavascriptArray *)0x0 && typedArrayBase == (TypedArrayBase *)0x0) {
    bVar4 = VarIs<Js::TypedArrayBase,Js::RecyclableObject>(obj);
    if (bVar4) {
      local_50 = UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>(obj);
    }
    else {
LAB_00b99fd7:
      local_50 = (TypedArrayBase *)0x0;
    }
    *(undefined1 *)((long)local_80 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    local_40 = (JavascriptArray *)
               ArraySpeciesCreate<unsigned_long>
                         (obj,length,scriptContext,(bool *)0x0,(bool *)0x0,local_31);
  }
  else {
    if (typedArrayBase == (TypedArrayBase *)0x0) goto LAB_00b99fd7;
    pvVar6 = Arguments::operator[](args,0);
    defaultConstructor = TypedArrayBase::GetDefaultConstructor(pvVar6,scriptContext);
    *(undefined1 *)((long)local_80 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    instanceObj = (JavascriptFunction *)
                  JavascriptOperators::SpeciesConstructor
                            ((RecyclableObject *)typedArrayBase,defaultConstructor,scriptContext);
    JsReentLock::MutateArrayObject((JsReentLock *)local_80);
    *(bool *)((long)local_80 + 0x108) = true;
    local_31[0] = false;
    bVar4 = JavascriptOperators::IsConstructor((RecyclableObject *)instanceObj);
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x25cd,"(JavascriptOperators::IsConstructor(constructor))",
                                  "JavascriptOperators::IsConstructor(constructor)");
      if (!bVar4) goto LAB_00b9a98c;
      *puVar7 = 0;
    }
    *(undefined1 *)((long)local_80 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    pTVar1 = scriptContext->threadContext;
    auStack_d0 = (undefined1  [8])instanceObj;
    element = (Var)length;
    local_c0 = scriptContext;
    if (instanceObj == defaultConstructor) {
      bVar4 = pTVar1->reentrancySafeOrHandled;
      pTVar1->reentrancySafeOrHandled = true;
      pvVar6 = anon_func::anon_class_24_1_2f014396::
               anon_class_24_3_af332ec1_for_newObjectCreationFunction::operator()
                         ((anon_class_24_3_af332ec1_for_newObjectCreationFunction *)auStack_d0);
      pTVar1->reentrancySafeOrHandled = bVar4;
    }
    else {
      implicitCall.newObjectCreationFunction.length = length;
      implicitCall.newObjectCreationFunction.constructor = (RecyclableObject *)instanceObj;
      implicitCall.newObjectCreationFunction.scriptContext = scriptContext;
      pvVar6 = ThreadContext::
               ExecuteImplicitCall<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_chakra_core[P]ChakraCore_lib_Runtime___Language_JavascriptOperators_inl:168:95)>
                         (pTVar1,(RecyclableObject *)instanceObj,ImplicitCall_Accessor,implicitCall)
      ;
    }
    local_40 = (JavascriptArray *)VarTo<Js::RecyclableObject>(pvVar6);
    JsReentLock::MutateArrayObject((JsReentLock *)local_80);
    local_50 = typedArrayBase;
  }
  *(bool *)((long)local_80 + 0x108) = true;
  if (local_40 == (JavascriptArray *)0x0) {
    if (length >> 0x20 != 0) {
      JavascriptError::ThrowRangeError(scriptContext,-0x7ff5ec5b,(PCWSTR)0x0);
    }
    this = JavascriptLibrary::CreateArray
                     ((scriptContext->super_ScriptContextBase).javascriptLibrary,(uint32)length);
    local_40 = this;
    if ((this->head).ptr == EmptySegment) {
      AllocateHead<void*>(this);
    }
  }
  else {
    bVar4 = IsNonES5Array(local_40);
    if ((bVar4) &&
       (this = UnsafeVarTo<Js::JavascriptArray>(local_40), this != (JavascriptArray *)0x0)) {
      bVar4 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(this);
      if ((bVar4) &&
         (this_00 = UnsafeVarTo<Js::JavascriptCopyOnAccessNativeIntArray>(this),
         this_00 != (JavascriptCopyOnAccessNativeIntArray *)0x0)) {
        JavascriptCopyOnAccessNativeIntArray::ConvertCopyOnAccessSegment(this_00);
      }
      JsReentLock::setSecondObjectForMutation((JsReentLock *)local_80,this);
    }
    else {
      this = (JavascriptArray *)0x0;
    }
  }
  auStack_d0 = (undefined1  [8])0x0;
  if (local_98 == (JavascriptArray *)0x0) {
LAB_00b9a46d:
    if (local_50 == (TypedArrayBase *)0x0) {
      *(undefined1 *)((long)local_80 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      local_40 = (JavascriptArray *)
                 MapObjectHelper<unsigned_long>
                           (obj,length,0,(RecyclableObject *)local_40,this,local_31[0],
                            (RecyclableObject *)jsReentLock._24_8_,local_a8,scriptContext);
      goto LAB_00b9a7c2;
    }
    bVar4 = VarIsCorrectType<Js::TypedArrayBase>(local_50);
    if (!bVar4) {
      bVar4 = VarIsCorrectType<Js::TypedArrayBase>(local_50);
      if (!bVar4) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x2632,"(VarIsCorrectType(typedArrayBase))",
                                    "VarIsCorrectType(typedArrayBase)");
        if (!bVar4) goto LAB_00b9a98c;
        *puVar7 = 0;
      }
      Throw::FatalInternalError(-0x7fffbffb);
    }
    bVar4 = VarIs<Js::TypedArrayBase,Js::RecyclableObject>((RecyclableObject *)local_40);
    if (bVar4) {
      pTVar11 = UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>((RecyclableObject *)local_40);
    }
    else {
      pTVar11 = (TypedArrayBase *)0x0;
    }
    if (this == (JavascriptArray *)0x0 && pTVar11 == (TypedArrayBase *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x2639,"(newArr != nullptr)","newArr != nullptr");
      if (bVar4) {
        *puVar7 = 0;
        Throw::FatalInternalError(-0x7fffbffb);
      }
LAB_00b9a98c:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    if (length >> 0x20 != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x263c,"(length <= 0xffffffff)","length <= UINT_MAX");
      if (!bVar4) goto LAB_00b9a98c;
      *puVar7 = 0;
    }
    uVar12 = (ulong)(local_50->super_ArrayBufferParent).super_ArrayObject.length;
    if (uVar12 < length) {
      length = uVar12;
    }
    local_a0 = this;
    if (length != 0) {
      local_88 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      uVar12 = 0;
      local_b8 = length;
      do {
        iVar5 = (*(local_50->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                  super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x72])(local_50,uVar12 & 0xffffffff);
        auStack_d0 = (undefined1  [8])CONCAT44(extraout_var,iVar5);
        *(undefined1 *)((long)local_80 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        pTVar1 = scriptContext->threadContext;
        local_98 = (JavascriptArray *)CONCAT71(local_98._1_7_,pTVar1->reentrancySafeOrHandled);
        pTVar1->reentrancySafeOrHandled = true;
        ThreadContext::CheckAndResetReentrancySafeOrHandled(pTVar1);
        if (scriptContext->threadContext->noJsReentrancy == true) {
          Throw::FatalJsReentrancyError();
        }
        p_Var8 = RecyclableObject::GetEntryPoint((RecyclableObject *)jsReentLock._24_8_);
        CheckIsExecutable((RecyclableObject *)jsReentLock._24_8_,p_Var8);
        p_Var8 = RecyclableObject::GetEntryPoint((RecyclableObject *)jsReentLock._24_8_);
        local_b0 = (JavascriptFunction *)auStack_d0;
        if ((int)uVar12 < 0) {
          local_90 = (double)(uVar12 & 0xffffffff);
          uVar9 = NumberUtilities::ToSpecial(local_90);
          bVar4 = NumberUtilities::IsNan(local_90);
          if (((bVar4) &&
              (uVar10 = NumberUtilities::ToSpecial(local_90), uVar10 != 0xfff8000000000000)) &&
             (uVar10 = NumberUtilities::ToSpecial(local_90), uVar10 != 0x7ff8000000000000)) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *local_88 = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                        ,0xa2,
                                        "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                        ,"We should only produce a NaN with this value");
            if (!bVar4) goto LAB_00b9a98c;
            *local_88 = 0;
          }
          uVar13 = uVar9 ^ 0xfffc000000000000;
        }
        else {
          uVar13 = uVar12 + 0x1000000000000;
        }
        pvVar6 = (*p_Var8)((RecyclableObject *)jsReentLock._24_8_,(CallInfo)jsReentLock._24_8_,
                           0x2000004,0,0,0,0,0x2000004,local_a8,local_b0,uVar13,obj);
        pTVar1->reentrancySafeOrHandled = local_98._0_1_;
        JsReentLock::MutateArrayObject((JsReentLock *)local_80);
        *(bool *)((long)local_80 + 0x108) = true;
        if (pTVar11 == (TypedArrayBase *)0x0) {
          (*(local_a0->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                    (local_a0,uVar12 & 0xffffffff,pvVar6,0);
        }
        else {
          *(undefined1 *)((long)local_80 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          (*(pTVar11->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
            super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x70])(pTVar11,uVar12 & 0xffffffff,pvVar6);
          JsReentLock::MutateArrayObject((JsReentLock *)local_80);
          *(bool *)((long)local_80 + 0x108) = true;
        }
        uVar12 = uVar12 + 1;
      } while (local_b8 != uVar12);
    }
  }
  else {
    bVar4 = IsNonES5Array(obj);
    if (!bVar4) {
      bVar4 = VarIs<Js::ES5Array,Js::RecyclableObject>(obj);
      if (!bVar4) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x2602,"(VarIs<ES5Array>(obj))",
                                    "The array should have been converted to an ES5Array");
        if (!bVar4) goto LAB_00b9a98c;
        *puVar7 = 0;
      }
      goto LAB_00b9a46d;
    }
    if (length >> 0x20 != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x2609,"(length <= 0xffffffff)","length <= UINT_MAX");
      if (!bVar4) goto LAB_00b9a98c;
      *puVar7 = 0;
    }
    local_a0 = this;
    if ((uint32)length != 0) {
      local_88 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      local_b8 = length & 0xffffffff;
      uVar12 = 0;
      do {
        *(undefined1 *)((long)local_80 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        index = (uint32)uVar12;
        iVar5 = (*(local_98->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                  [0x71])(local_98,uVar12 & 0xffffffff,auStack_d0);
        JsReentLock::MutateArrayObject((JsReentLock *)local_80);
        *(bool *)((long)local_80 + 0x108) = true;
        if (iVar5 != 0) {
          *(undefined1 *)((long)local_80 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          pTVar1 = scriptContext->threadContext;
          local_b0 = (JavascriptFunction *)CONCAT71(local_b0._1_7_,pTVar1->reentrancySafeOrHandled);
          pTVar1->reentrancySafeOrHandled = true;
          ThreadContext::CheckAndResetReentrancySafeOrHandled(pTVar1);
          if (scriptContext->threadContext->noJsReentrancy == true) {
            Throw::FatalJsReentrancyError();
          }
          p_Var8 = RecyclableObject::GetEntryPoint((RecyclableObject *)jsReentLock._24_8_);
          CheckIsExecutable((RecyclableObject *)jsReentLock._24_8_,p_Var8);
          p_Var8 = RecyclableObject::GetEntryPoint((RecyclableObject *)jsReentLock._24_8_);
          auVar3 = auStack_d0;
          if ((int)index < 0) {
            local_90 = (double)(uVar12 & 0xffffffff);
            uVar9 = NumberUtilities::ToSpecial(local_90);
            bVar4 = NumberUtilities::IsNan(local_90);
            if (((bVar4) &&
                (uVar10 = NumberUtilities::ToSpecial(local_90), uVar10 != 0xfff8000000000000)) &&
               (uVar10 = NumberUtilities::ToSpecial(local_90), uVar10 != 0x7ff8000000000000)) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *local_88 = 1;
              bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                          ,0xa2,
                                          "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                          ,"We should only produce a NaN with this value");
              if (!bVar4) goto LAB_00b9a98c;
              *local_88 = 0;
            }
            uVar13 = uVar9 ^ 0xfffc000000000000;
          }
          else {
            uVar13 = uVar12 + 0x1000000000000;
          }
          pvVar6 = (*p_Var8)((RecyclableObject *)jsReentLock._24_8_,(CallInfo)jsReentLock._24_8_,
                             0x2000004,0,0,0,0,0x2000004,local_a8,auVar3,uVar13,local_98);
          pTVar1->reentrancySafeOrHandled = local_b0._0_1_;
          JsReentLock::MutateArrayObject((JsReentLock *)local_80);
          *(bool *)((long)local_80 + 0x108) = true;
          if ((local_a0 == (JavascriptArray *)0x0) || (local_31[0] != true)) {
            *(undefined1 *)((long)local_80 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
            iVar5 = (*(local_40->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                      super_FinalizableObject.super_IRecyclerVisitedObject.
                      _vptr_IRecyclerVisitedObject[0x29])(local_40,uVar12 & 0xffffffff,pvVar6,4);
            ThrowErrorOnFailure(iVar5,scriptContext,index);
            JsReentLock::MutateArrayObject((JsReentLock *)local_80);
            *(bool *)((long)local_80 + 0x108) = true;
          }
          else {
            DirectSetItemAt<void*>(local_a0,index,pvVar6);
          }
          bVar4 = IsNonES5Array(obj);
          if (!bVar4) {
            bVar4 = VarIs<Js::ES5Array,Js::RecyclableObject>(obj);
            if (!bVar4) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *local_88 = 1;
              bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                          ,0x262b,"(VarIs<ES5Array>(obj))",
                                          "The array should have been converted to an ES5Array");
              if (!bVar4) goto LAB_00b9a98c;
              *local_88 = 0;
            }
            *(undefined1 *)((long)local_80 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
            local_40 = (JavascriptArray *)
                       MapObjectHelper<unsigned_long>
                                 (obj,length,uVar12 + 1,(RecyclableObject *)local_40,local_a0,
                                  local_31[0],(RecyclableObject *)jsReentLock._24_8_,local_a8,
                                  scriptContext);
            goto LAB_00b9a7c2;
          }
        }
        uVar12 = uVar12 + 1;
      } while (local_b8 != uVar12);
    }
  }
  bVar4 = IsNonES5Array(local_40);
  if (bVar4) {
    (*(local_a0->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x74])();
  }
LAB_00b9a7c2:
  *(undefined1 *)((long)local_80 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return local_40;
}

Assistant:

Var JavascriptArray::MapHelper(JavascriptArray* pArr, Js::TypedArrayBase* typedArrayBase, RecyclableObject* obj, T length, Arguments& args, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, pArr);

        RecyclableObject* newObj = nullptr;
        JavascriptArray* newArr = nullptr;
        bool isTypedArrayEntryPoint = typedArrayBase != nullptr;
        bool isBuiltinArrayCtor = true;

        if (args.Info.Count < 2 || !JavascriptConversion::IsCallable(args[1]))
        {
            if (isTypedArrayEntryPoint)
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("[TypedArray].prototype.map"));
            }
            else
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("Array.prototype.map"));
            }
        }

        RecyclableObject* callBackFn = VarTo<RecyclableObject>(args[1]);
        Var thisArg;

        if (args.Info.Count > 2)
        {
            thisArg = args[2];
        }
        else
        {
            thisArg = scriptContext->GetLibrary()->GetUndefined();
        }

        // If we came from Array.prototype.map and source object is not a JavascriptArray, source could be a TypedArray
        if (!isTypedArrayEntryPoint && pArr == nullptr && VarIs<TypedArrayBase>(obj))
        {
            typedArrayBase = UnsafeVarTo<TypedArrayBase>(obj);
        }

        // If the entry point is %TypedArray%.prototype.map or the source object is an Array exotic object we should try to load the constructor property
        // and use it to construct the return object.
        if (isTypedArrayEntryPoint)
        {
            JavascriptFunction* defaultConstructor = TypedArrayBase::GetDefaultConstructor(args[0], scriptContext);
            JS_REENTRANT(jsReentLock,
                RecyclableObject* constructor = JavascriptOperators::SpeciesConstructor(typedArrayBase, defaultConstructor, scriptContext));

            isBuiltinArrayCtor = false;

            AssertOrFailFast(JavascriptOperators::IsConstructor(constructor));

            bool isDefaultConstructor = constructor == defaultConstructor;
            JS_REENTRANT(jsReentLock,
                newObj = VarTo<RecyclableObject>(
                    JavascriptOperators::NewObjectCreationHelper_ReentrancySafe(constructor, isDefaultConstructor, scriptContext->GetThreadContext(), [=]()->Js::Var
                    {
                        Js::Var constructorArgs[] = {constructor, JavascriptNumber::ToVar(length, scriptContext) };
                        Js::CallInfo constructorCallInfo(Js::CallFlags_New, _countof(constructorArgs));
                        return TypedArrayBase::TypedArrayCreate(constructor, &Js::Arguments(constructorCallInfo, constructorArgs), (uint32)length, scriptContext);
                    }));
            )
        }
        // skip the typed array and "pure" array case, we still need to handle special arrays like es5array, remote array, and proxy of array.
        else
        {
            JS_REENTRANT_NO_MUTATE(jsReentLock, newObj = ArraySpeciesCreate(obj, length, scriptContext, nullptr, nullptr, &isBuiltinArrayCtor));
        }

        if (newObj == nullptr)
        {
            if (length > UINT_MAX)
            {
                JavascriptError::ThrowRangeError(scriptContext, JSERR_ArrayLengthConstructIncorrect);
            }
            newArr = scriptContext->GetLibrary()->CreateArray(static_cast<uint32>(length));
            newArr->EnsureHead<Var>();
            newObj = newArr;
        }
        else
        {
            // If the new object we created is an array, remember that as it will save us time setting properties in the object below
            newArr = JavascriptArray::TryVarToNonES5Array(newObj);
            if (newArr)
            {
#if ENABLE_COPYONACCESS_ARRAY
                JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(newArr);
#endif
                SET_SECOND_OBJECT_FOR_MUTATION(jsReentLock, newArr);
            }
        }

        Var element = nullptr;
        Var mappedValue = nullptr;
        CallInfo callBackFnInfo = CallInfo(CallFlags_Value, 4);

        // We at least have to have newObj as a valid object
        Assert(newObj);

        // The ArraySpeciesCreate call above could have converted the source array into an ES5Array. If this happens
        // we will process the array elements like an ES5Array.
        if (pArr && !JavascriptArray::IsNonES5Array(obj))
        {
            AssertOrFailFastMsg(VarIs<ES5Array>(obj), "The array should have been converted to an ES5Array");
            pArr = nullptr;
        }

        if (pArr != nullptr)
        {
            // If source is a JavascriptArray, newObj may or may not be an array based on what was in source's constructor property
            Assert(length <= UINT_MAX);
            for (uint32 k = 0; k < (uint32)length; k++)
            {
                JS_REENTRANT(jsReentLock, BOOL gotItem = pArr->DirectGetItemAtFull(k, &element));
                if (!gotItem)
                {
                    continue;
                }

                JS_REENTRANT(jsReentLock,
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        mappedValue = CALL_FUNCTION(scriptContext->GetThreadContext(), callBackFn, callBackFnInfo, thisArg,
                                element,
                                JavascriptNumber::ToVar(k, scriptContext),
                                pArr);
                    }
                    END_SAFE_REENTRANT_CALL
                );

                // If newArr is a valid pointer, then we constructed an array to return. Otherwise we need to do generic object operations
                if (newArr && isBuiltinArrayCtor)
                {
                    newArr->DirectSetItemAt(k, mappedValue);
                }
                else
                {
                    JS_REENTRANT(jsReentLock, ThrowErrorOnFailure(JavascriptArray::SetArrayLikeObjects(newObj, k, mappedValue), scriptContext, k));
                }

                // Side-effects in the callback function may have changed the source array into an ES5Array. If this happens
                // we will process the rest of the array elements like an ES5Array.
                if (!JavascriptArray::IsNonES5Array(obj))
                {
                    AssertOrFailFastMsg(VarIs<ES5Array>(obj), "The array should have been converted to an ES5Array");
                    JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::MapObjectHelper<T>(obj, length, k + 1, newObj, newArr, isBuiltinArrayCtor, callBackFn, thisArg, scriptContext));
                }
            }
        }
        else if (typedArrayBase != nullptr)
        {
            AssertAndFailFast(VarIsCorrectType(typedArrayBase));

            // Source is a TypedArray, we may have tried to call a constructor, but newObj may not be a TypedArray (or an array either)
            TypedArrayBase* newTypedArray = JavascriptOperators::TryFromVar<Js::TypedArrayBase>(newObj);

            if (!newTypedArray)
            {
                AssertAndFailFast(newArr != nullptr);
            }

            Assert(length <= UINT_MAX);
            uint32 end = (uint32)min(length, (T)typedArrayBase->GetLength());

            for (uint32 k = 0; k < end; k++)
            {
                // No need to do HasItem, as it cannot be observable unless 'typedArrayBase' is proxy. And we have established that it is indeed typedarray.

                element = typedArrayBase->DirectGetItem(k);
                JS_REENTRANT(jsReentLock,
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        mappedValue = CALL_FUNCTION(scriptContext->GetThreadContext(), callBackFn, callBackFnInfo, thisArg,
                                element,
                                JavascriptNumber::ToVar(k, scriptContext),
                                obj);
                    }
                    END_SAFE_REENTRANT_CALL
                );

                // If newObj is a TypedArray, set the mappedValue directly, otherwise it should be an array, set that item to that array
                if (newTypedArray)
                {
                    JS_REENTRANT(jsReentLock, newTypedArray->DirectSetItem(k, mappedValue));
                }
                else
                {
                    newArr->SetItem(k, mappedValue, PropertyOperation_None);
                }
            }
        }
        else
        {
            JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::MapObjectHelper<T>(obj, length, 0u, newObj, newArr, isBuiltinArrayCtor, callBackFn, thisArg, scriptContext));
        }

#ifdef VALIDATE_ARRAY
        if (JavascriptArray::IsNonES5Array(newObj))
        {
            newArr->ValidateArray();
        }
#endif

        return newObj;
    }